

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

ServiceDescriptorProto *
google::protobuf::descriptor_unittest::AddService(FileDescriptorProto *file,string *name)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar1;
  Arena *arena;
  
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                     (&(file->field_0)._impl_.service_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  arena = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(pVVar1->field_0)._impl_.name_,name,arena);
  return pVVar1;
}

Assistant:

ServiceDescriptorProto* AddService(FileDescriptorProto* file,
                                   const std::string& name) {
  ServiceDescriptorProto* result = file->add_service();
  result->set_name(name);
  return result;
}